

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadWriteUnittest.cpp
# Opt level: O3

void __thiscall ReadWriteUnittest::FillFields(ReadWriteUnittest *this)

{
  pointer piVar1;
  pointer pdVar2;
  pointer pfVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  
  iVar9 = this->iSize;
  if (0 < iVar9) {
    iVar14 = this->jSize;
    iVar4 = 0;
    iVar5 = 0;
    iVar6 = iVar14;
    do {
      if (0 < iVar6) {
        piVar1 = (this->fieldInt3).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2 = (this->fieldDouble3).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar3 = (this->fieldFloat3).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar13 = this->kSize;
        iVar10 = 0;
        iVar11 = iVar5;
        do {
          if (0 < iVar13) {
            iVar7 = 0;
            iVar12 = iVar11;
            do {
              piVar1[(iVar6 * iVar7 + iVar10) * iVar9 + iVar5] = iVar12;
              iVar9 = this->iSize;
              iVar6 = this->jSize;
              iVar14 = (iVar6 * iVar7 + iVar10) * iVar9 + iVar5;
              pdVar2[iVar14] =
                   (double)iVar7 * -12.5 * (double)iVar5 +
                   (double)iVar5 * 1.125 + (double)iVar10 * 2.25;
              pfVar3[iVar14] =
                   (float)iVar7 * -16.0 * (float)iVar5 + (float)iVar5 * 1.5 + (float)iVar10 * 4.25;
              iVar7 = iVar7 + 1;
              iVar13 = this->kSize;
              iVar12 = iVar12 + iVar4;
              iVar14 = iVar6;
            } while (iVar7 < iVar13);
          }
          iVar10 = iVar10 + 1;
          iVar11 = iVar11 + 2;
          iVar6 = iVar14;
        } while (iVar10 < iVar14);
      }
      iVar5 = iVar5 + 1;
      iVar4 = iVar4 + -0xc;
    } while (iVar5 < iVar9);
    if (0 < iVar9) {
      piVar1 = (this->fieldInt2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar14 = this->kSize;
      iVar6 = 0;
      iVar4 = 0;
      do {
        if (0 < iVar14) {
          iVar5 = 0;
          iVar9 = iVar4;
          do {
            piVar1[this->iSize * iVar5 + iVar4] = iVar9;
            iVar5 = iVar5 + 1;
            iVar14 = this->kSize;
            iVar9 = iVar9 + iVar6;
          } while (iVar5 < iVar14);
          iVar9 = this->iSize;
        }
        iVar4 = iVar4 + 1;
        iVar6 = iVar6 + -0xc;
      } while (iVar4 < iVar9);
    }
  }
  iVar9 = this->jSize;
  if (0 < (long)iVar9) {
    pdVar2 = (this->fieldDouble1).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar3 = (this->fieldFloat1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      iVar14 = (int)lVar8 * (int)lVar8;
      pdVar2[lVar8] = (double)iVar14 + 2.875;
      pfVar3[lVar8] = (float)iVar14 + 3.5;
      lVar8 = lVar8 + 1;
    } while (iVar9 != lVar8);
  }
  return;
}

Assistant:

void FillFields() {
        for (int i = 0; i < iSize; ++i)
            for (int j = 0; j < jSize; ++j)
                for (int k = 0; k < kSize; ++k)
                {
                    fieldInt3[i + j*iSize + k*iSize*jSize] = i + 2*j - 12*k*i;
                    fieldDouble3[i + j*iSize + k*iSize*jSize] = 1.125*i + 2.25*j - 12.5*k*i;
                    fieldFloat3[i + j*iSize + k*iSize*jSize] = 1.5f*i + 4.25f*j - 16.0f*k*i;
                }

        for (int i = 0; i < iSize; ++i)
            for (int k = 0; k < kSize; ++k)
            {
                fieldInt2[i + k*iSize] = i - 12*k*i;
            }

        for (int j = 0; j < jSize; ++j)
        {
            fieldDouble1[j] = j*j+2.875;
            fieldFloat1[j] = j*j+3.5f;
        }
    }